

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O0

StringBuilder * __thiscall nv::StringBuilder::reserve(StringBuilder *this,uint size_hint)

{
  int iVar1;
  char *pcVar2;
  uint size_hint_local;
  StringBuilder *this_local;
  
  if ((size_hint == 0) &&
     (iVar1 = nvAbort("size_hint != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x18a,"StringBuilder &nv::StringBuilder::reserve(uint)"), iVar1 == 1)) {
    raise(5);
  }
  if (this->m_size < size_hint) {
    pcVar2 = anon_unknown.dwarf_48c640::strReAlloc(this->m_str,size_hint);
    this->m_str = pcVar2;
    this->m_size = size_hint;
  }
  return this;
}

Assistant:

StringBuilder & StringBuilder::reserve( uint size_hint )
{
	nvCheck(size_hint != 0);
	if( size_hint > m_size ) {
		m_str = strReAlloc(m_str, size_hint);
		m_size = size_hint;
	}
	return *this;
}